

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::option_syntax_exception::option_syntax_exception
          (option_syntax_exception *this,string *text)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *in_stack_ffffffffffffff68;
  OptionParseException *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  string local_50 [32];
  string local_30 [48];
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffff70;
  std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::operator+(__lhs,in_RDI);
  std::operator+(__lhs,in_RDI);
  std::operator+(__lhs,(char *)in_RDI);
  OptionParseException::OptionParseException(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  *(undefined ***)in_RDI = &PTR__option_syntax_exception_00187590;
  return;
}

Assistant:

explicit option_syntax_exception(const std::string& text)
    : OptionParseException("Argument " + LQUOTE + text + RQUOTE +
        " starts with a - but has incorrect syntax")
    {
    }